

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump2.cpp
# Opt level: O0

void __thiscall DumpParams::resolveLineFormat(DumpParams *this)

{
  DumpParams *this_local;
  
  if (this->unitsPerLine == 0) {
    switch(this->dumpUnitSize) {
    case 1:
      this->unitsPerLine = 0x20;
      break;
    case 2:
      this->unitsPerLine = 0x10;
      break;
    case 4:
      this->unitsPerLine = 8;
      break;
    case 8:
      this->unitsPerLine = 4;
    }
    if (this->dumpformat == 0) {
      this->unitsPerLine = this->unitsPerLine / 2;
    }
    else if (this->dumpformat == 2) {
      this->unitsPerLine = 0x40;
    }
  }
  return;
}

Assistant:

void resolveLineFormat()
    {
        if (unitsPerLine==0) {
            switch(dumpUnitSize)
            {
                case 1: unitsPerLine = 32; break;
                case 2: unitsPerLine = 16; break;
                case 4: unitsPerLine = 8; break;
                case 8: unitsPerLine = 4; break;
            }
            switch(dumpformat)
            {
                case DUMP_BOTH:
                    unitsPerLine /= 2;
                    break;
                case DUMP_ASCII:
                    unitsPerLine = 64;
                    break;
            }
        }

    }